

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage2d_incomplete_framebuffer
               (NegativeTestContext *ctx)

{
  GLuint local_50;
  GLuint local_4c;
  GLuint fbo;
  GLuint texture [2];
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  local_50 = 0x1234;
  glu::CallLogWrapper::glGenTextures(&local_10->super_CallLogWrapper,2,&local_4c);
  glu::CallLogWrapper::glBindTexture(&local_10->super_CallLogWrapper,0xde1,local_4c);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0xde1,0,0x1908,4,4,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glBindTexture(&local_10->super_CallLogWrapper,0x8513,fbo);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0x8515,0,0x1908,4,4,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0x8517,0,0x1908,4,4,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0x8519,0,0x1908,4,4,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0x8516,0,0x1908,4,4,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0x8518,0,0x1908,4,4,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0x851a,0,0x1908,4,4,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0);
  glu::CallLogWrapper::glGenFramebuffers(&local_10->super_CallLogWrapper,1,&local_50);
  glu::CallLogWrapper::glBindFramebuffer(&local_10->super_CallLogWrapper,0x8d40,local_50);
  glu::CallLogWrapper::glCheckFramebufferStatus(&local_10->super_CallLogWrapper,0x8d40);
  NegativeTestContext::expectError(local_10,0);
  glu::CallLogWrapper::glCopyTexSubImage2D(&local_10->super_CallLogWrapper,0xde1,0,0,0,0,0,0,0);
  NegativeTestContext::expectError(local_10,0x506);
  glu::CallLogWrapper::glCopyTexSubImage2D(&local_10->super_CallLogWrapper,0x8515,0,0,0,0,0,0,0);
  NegativeTestContext::expectError(local_10,0x506);
  glu::CallLogWrapper::glCopyTexSubImage2D(&local_10->super_CallLogWrapper,0x8517,0,0,0,0,0,0,0);
  NegativeTestContext::expectError(local_10,0x506);
  glu::CallLogWrapper::glCopyTexSubImage2D(&local_10->super_CallLogWrapper,0x8519,0,0,0,0,0,0,0);
  NegativeTestContext::expectError(local_10,0x506);
  glu::CallLogWrapper::glCopyTexSubImage2D(&local_10->super_CallLogWrapper,0x8516,0,0,0,0,0,0,0);
  NegativeTestContext::expectError(local_10,0x506);
  glu::CallLogWrapper::glCopyTexSubImage2D(&local_10->super_CallLogWrapper,0x8518,0,0,0,0,0,0,0);
  NegativeTestContext::expectError(local_10,0x506);
  glu::CallLogWrapper::glCopyTexSubImage2D(&local_10->super_CallLogWrapper,0x851a,0,0,0,0,0,0,0);
  NegativeTestContext::expectError(local_10,0x506);
  glu::CallLogWrapper::glBindFramebuffer(&local_10->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteFramebuffers(&local_10->super_CallLogWrapper,1,&local_50);
  glu::CallLogWrapper::glDeleteTextures(&local_10->super_CallLogWrapper,2,&local_4c);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void copytexsubimage2d_incomplete_framebuffer (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");

	GLuint texture[2];
	GLuint fbo = 0x1234;

	ctx.glGenTextures			(2, texture);
	ctx.glBindTexture			(GL_TEXTURE_2D, texture[0]);
	ctx.glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGBA, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glBindTexture			(GL_TEXTURE_CUBE_MAP, texture[1]);
	ctx.glTexImage2D			(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGBA, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glTexImage2D			(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGBA, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glTexImage2D			(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGBA, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glTexImage2D			(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGBA, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glTexImage2D			(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGBA, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glTexImage2D			(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGBA, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_NO_ERROR);

	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.expectError(GL_NO_ERROR);

	ctx.glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexSubImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, 0, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexSubImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, 0, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexSubImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, 0, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexSubImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, 0, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexSubImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, 0, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glCopyTexSubImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, 0, 0, 0, 0, 0, 0);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);

	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.glDeleteTextures(2, texture);

	ctx.endSection();
}